

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O3

void cali_channel_push_snapshot
               (cali_id_t chn_id,int param_2,int n,cali_id_t *trigger_info_attr_list,
               cali_variant_t *trigger_info_val_list)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  Attribute AVar4;
  uint uVar5;
  long lVar6;
  size_t n_00;
  SnapshotView trigger_info_00;
  Channel channel;
  Caliper c;
  Attribute attr [64];
  Variant data [64];
  FixedSizeSnapshotRecord<64UL> trigger_info;
  undefined1 local_c90 [56];
  Attribute local_c58 [64];
  Variant local_a58 [64];
  Entry local_650 [64];
  SnapshotBuilder local_50;
  
  local_c90._16_8_ = chn_id;
  cali::Caliper::Caliper((Caliper *)(local_c90 + 0x18));
  memset(local_c58,0,0x200);
  memset(local_a58,0,0x400);
  uVar5 = 0;
  if (0 < n) {
    uVar5 = n;
  }
  n_00 = 0x40;
  if ((int)uVar5 < 0x40) {
    n_00 = (size_t)uVar5;
  }
  if (0 < n) {
    lVar6 = 0;
    do {
      AVar4 = cali::Caliper::get_attribute
                        ((Caliper *)(local_c90 + 0x18),
                         *(cali_id_t *)((long)trigger_info_attr_list + lVar6));
      *(Node **)((long)&local_c58[0].m_node + lVar6) = AVar4.m_node;
      puVar1 = (undefined8 *)((long)&trigger_info_val_list->type_and_size + lVar6 * 2);
      uVar2 = puVar1[1];
      *(undefined8 *)((long)&local_a58[0].m_v.type_and_size + lVar6 * 2) = *puVar1;
      *(undefined8 *)((long)&local_a58[0].m_v.value + lVar6 * 2) = uVar2;
      lVar6 = lVar6 + 8;
    } while (n_00 * 8 - lVar6 != 0);
  }
  memset(local_650,0,0x600);
  local_50.m_capacity = 0x40;
  local_50.m_len = 0;
  local_50.m_skipped = 0;
  local_50.m_data = local_650;
  cali::Caliper::make_record
            ((Caliper *)(local_c90 + 0x18),n_00,local_c58,local_a58,&local_50,(Node *)0x0);
  cali::Caliper::get_channel((Caliper *)local_c90,(cali_id_t)(local_c90 + 0x18));
  if (((GlobalData *)local_c90._8_8_ != (GlobalData *)0x0) &&
     (0 < *(_Atomic_word *)(local_c90._8_8_ + 8))) {
    bVar3 = cali::Channel::is_active((Channel *)local_c90);
    if (bVar3) {
      trigger_info_00.m_len = local_50.m_len;
      trigger_info_00.m_data = local_50.m_data;
      cali::Caliper::push_snapshot
                ((Caliper *)(local_c90 + 0x18),(ChannelBody *)local_c90._0_8_,trigger_info_00);
    }
  }
  cali::Channel::~Channel((Channel *)local_c90);
  return;
}

Assistant:

void cali_channel_push_snapshot(
    cali_id_t chn_id,
    int /*scope*/,
    int                  n,
    const cali_id_t      trigger_info_attr_list[],
    const cali_variant_t trigger_info_val_list[]
)
{
    Caliper c;

    Attribute attr[64];
    Variant   data[64];

    n = std::min(std::max(n, 0), 64);

    for (int i = 0; i < n; ++i) {
        attr[i] = c.get_attribute(trigger_info_attr_list[i]);
        data[i] = Variant(trigger_info_val_list[i]);
    }

    FixedSizeSnapshotRecord<64> trigger_info;
    c.make_record(n, attr, data, trigger_info.builder());

    Channel channel = c.get_channel(chn_id);

    if (channel && channel.is_active())
        c.push_snapshot(channel.body(), trigger_info.view());
}